

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O3

QString * __thiscall
QMap<int,_QString>::value
          (QString *__return_storage_ptr__,QMap<int,_QString> *this,int *key,QString *defaultValue)

{
  int iVar1;
  QMapData<std::map<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>
  *pQVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  
  pQVar2 = (this->d).d.ptr;
  if ((pQVar2 != (QMapData<std::map<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>
                  *)0x0) &&
     (p_Var4 = *(_Base_ptr *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8),
     p_Var4 != (_Base_ptr)0x0)) {
    p_Var5 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header;
    iVar1 = *key;
    p_Var3 = &p_Var5->_M_header;
    do {
      if (iVar1 <= (int)p_Var4[1]._M_color) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < iVar1];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var5) && ((int)p_Var3[1]._M_color <= iVar1)) {
      p_Var4 = p_Var3[1]._M_parent;
      (__return_storage_ptr__->d).d = (Data *)p_Var4;
      (__return_storage_ptr__->d).ptr = (char16_t *)p_Var3[1]._M_left;
      p_Var3 = p_Var3[1]._M_right;
      goto LAB_00510036;
    }
  }
  p_Var4 = (_Base_ptr)(defaultValue->d).d;
  (__return_storage_ptr__->d).d = (Data *)p_Var4;
  (__return_storage_ptr__->d).ptr = (defaultValue->d).ptr;
  p_Var3 = (_Base_ptr)(defaultValue->d).size;
LAB_00510036:
  (__return_storage_ptr__->d).size = (qsizetype)p_Var3;
  if (p_Var4 != (_Base_ptr)0x0) {
    LOCK();
    (((QArrayData *)&p_Var4->_M_color)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&p_Var4->_M_color)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }